

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_FSA_dns.c
# Opt level: O0

int fS(int Ns,sunrealtype t,N_Vector y,N_Vector ydot,int iS,N_Vector yS,N_Vector ySdot,
      void *user_data,N_Vector tmp1,N_Vector tmp2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_a0;
  double local_98;
  double local_90;
  sunrealtype sd3;
  sunrealtype sd2;
  sunrealtype sd1;
  sunrealtype s3;
  sunrealtype s2;
  sunrealtype s1;
  sunrealtype y3;
  sunrealtype y2;
  sunrealtype y1;
  sunrealtype p3;
  sunrealtype p2;
  sunrealtype p1;
  UserData data;
  N_Vector ySdot_local;
  N_Vector yS_local;
  
  dVar1 = **(double **)((long)y->content + 0x10);
  dVar2 = *(double *)(*(long *)((long)y->content + 0x10) + 8);
  dVar3 = *(double *)(*(long *)((long)y->content + 0x10) + 0x10);
  local_a0 = *(double *)(*(long *)((long)yS->content + 0x10) + 8);
  local_90 = *(double *)((long)user_data + 8) * dVar2 *
             *(double *)(*(long *)((long)yS->content + 0x10) + 0x10) +
             (*(double *)((long)user_data + 8) * dVar3 * local_a0 -
             *user_data * **(double **)((long)yS->content + 0x10));
  local_a0 = (*(double *)((long)user_data + 0x10) + *(double *)((long)user_data + 0x10)) * dVar2 *
             local_a0;
  local_98 = -local_90 - local_a0;
  if (iS == 0) {
    local_90 = -dVar1 + local_90;
    local_98 = dVar1 + local_98;
  }
  else if (iS == 1) {
    local_90 = dVar2 * dVar3 + local_90;
    local_98 = -dVar2 * dVar3 + local_98;
  }
  else if (iS == 2) {
    local_98 = -dVar2 * dVar2 + local_98;
    local_a0 = dVar2 * dVar2 + local_a0;
  }
  **(double **)((long)ySdot->content + 0x10) = local_90;
  *(double *)(*(long *)((long)ySdot->content + 0x10) + 8) = local_98;
  *(double *)(*(long *)((long)ySdot->content + 0x10) + 0x10) = local_a0;
  return 0;
}

Assistant:

static int fS(int Ns, sunrealtype t, N_Vector y, N_Vector ydot, int iS,
              N_Vector yS, N_Vector ySdot, void* user_data, N_Vector tmp1,
              N_Vector tmp2)
{
  UserData data;
  sunrealtype p1, p2, p3;
  sunrealtype y1, y2, y3;
  sunrealtype s1, s2, s3;
  sunrealtype sd1, sd2, sd3;

  data = (UserData)user_data;
  p1   = data->p[0];
  p2   = data->p[1];
  p3   = data->p[2];

  y1 = Ith(y, 1);
  y2 = Ith(y, 2);
  y3 = Ith(y, 3);
  s1 = Ith(yS, 1);
  s2 = Ith(yS, 2);
  s3 = Ith(yS, 3);

  sd1 = -p1 * s1 + p2 * y3 * s2 + p2 * y2 * s3;
  sd3 = 2 * p3 * y2 * s2;
  sd2 = -sd1 - sd3;

  switch (iS)
  {
  case 0:
    sd1 += -y1;
    sd2 += y1;
    break;
  case 1:
    sd1 += y2 * y3;
    sd2 += -y2 * y3;
    break;
  case 2:
    sd2 += -y2 * y2;
    sd3 += y2 * y2;
    break;
  }

  Ith(ySdot, 1) = sd1;
  Ith(ySdot, 2) = sd2;
  Ith(ySdot, 3) = sd3;

  return (0);
}